

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Man.c
# Opt level: O3

void Llb_ManStop(Llb_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  DdManager *pDVar2;
  Vec_Int_t *pVVar3;
  long lVar4;
  
  if (p->pMatrix != (Llb_Mtr_t *)0x0) {
    Llb_MtrFree(p->pMatrix);
  }
  pVVar1 = p->vGroups;
  if (0 < pVVar1->nSize) {
    lVar4 = 0;
    do {
      Llb_ManGroupStop((Llb_Grp_t *)pVVar1->pArray[lVar4]);
      lVar4 = lVar4 + 1;
      pVVar1 = p->vGroups;
    } while (lVar4 < pVVar1->nSize);
  }
  if (p->dd != (DdManager *)0x0) {
    Extra_StopManager(p->dd);
  }
  pDVar2 = p->ddG;
  if (pDVar2 != (DdManager *)0x0) {
    if (pDVar2->bFunc != (DdNode *)0x0) {
      Cudd_RecursiveDeref(pDVar2,pDVar2->bFunc);
      pDVar2 = p->ddG;
    }
    Extra_StopManager(pDVar2);
  }
  pDVar2 = p->ddR;
  if (pDVar2 != (DdManager *)0x0) {
    if (pDVar2->bFunc != (DdNode *)0x0) {
      Cudd_RecursiveDeref(pDVar2,pDVar2->bFunc);
    }
    pVVar1 = p->vRings;
    if (0 < pVVar1->nSize) {
      lVar4 = 0;
      do {
        Cudd_RecursiveDeref(p->ddR,(DdNode *)pVVar1->pArray[lVar4]);
        lVar4 = lVar4 + 1;
        pVVar1 = p->vRings;
      } while (lVar4 < pVVar1->nSize);
    }
    Extra_StopManager(p->ddR);
  }
  Aig_ManStop(p->pAig);
  pVVar1 = p->vGroups;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
      p->vGroups->pArray = (void **)0x0;
      pVVar1 = p->vGroups;
      if (pVVar1 == (Vec_Ptr_t *)0x0) goto LAB_008364be;
    }
    free(pVVar1);
    p->vGroups = (Vec_Ptr_t *)0x0;
  }
LAB_008364be:
  pVVar3 = p->vVar2Obj;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      p->vVar2Obj->pArray = (int *)0x0;
      pVVar3 = p->vVar2Obj;
      if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_008364fa;
    }
    free(pVVar3);
    p->vVar2Obj = (Vec_Int_t *)0x0;
  }
LAB_008364fa:
  pVVar3 = p->vObj2Var;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      p->vObj2Var->pArray = (int *)0x0;
      pVVar3 = p->vObj2Var;
      if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_00836536;
    }
    free(pVVar3);
    p->vObj2Var = (Vec_Int_t *)0x0;
  }
LAB_00836536:
  pVVar3 = p->vVarBegs;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      p->vVarBegs->pArray = (int *)0x0;
      pVVar3 = p->vVarBegs;
      if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_00836572;
    }
    free(pVVar3);
    p->vVarBegs = (Vec_Int_t *)0x0;
  }
LAB_00836572:
  pVVar3 = p->vVarEnds;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      p->vVarEnds->pArray = (int *)0x0;
      pVVar3 = p->vVarEnds;
      if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_008365ae;
    }
    free(pVVar3);
    p->vVarEnds = (Vec_Int_t *)0x0;
  }
LAB_008365ae:
  pVVar1 = p->vRings;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
      p->vRings->pArray = (void **)0x0;
      pVVar1 = p->vRings;
      if (pVVar1 == (Vec_Ptr_t *)0x0) goto LAB_008365ea;
    }
    free(pVVar1);
    p->vRings = (Vec_Ptr_t *)0x0;
  }
LAB_008365ea:
  pVVar3 = p->vNs2Glo;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      p->vNs2Glo->pArray = (int *)0x0;
      pVVar3 = p->vNs2Glo;
      if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_00836626;
    }
    free(pVVar3);
    p->vNs2Glo = (Vec_Int_t *)0x0;
  }
LAB_00836626:
  pVVar3 = p->vCs2Glo;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      p->vCs2Glo->pArray = (int *)0x0;
      pVVar3 = p->vCs2Glo;
      if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_00836662;
    }
    free(pVVar3);
    p->vCs2Glo = (Vec_Int_t *)0x0;
  }
LAB_00836662:
  pVVar3 = p->vGlo2Cs;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      p->vGlo2Cs->pArray = (int *)0x0;
      pVVar3 = p->vGlo2Cs;
      if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_0083669e;
    }
    free(pVVar3);
    p->vGlo2Cs = (Vec_Int_t *)0x0;
  }
LAB_0083669e:
  pVVar3 = p->vGlo2Ns;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      p->vGlo2Ns->pArray = (int *)0x0;
      pVVar3 = p->vGlo2Ns;
      if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_008366db;
    }
    free(pVVar3);
  }
LAB_008366db:
  free(p);
  return;
}

Assistant:

void Llb_ManStop( Llb_Man_t * p )
{
    Llb_Grp_t * pGrp;
    DdNode * bTemp;
    int i;

//    Vec_IntFreeP( &p->vMem );
//    Vec_PtrFreeP( &p->vTops );
//    Vec_PtrFreeP( &p->vBots );
//    Vec_VecFreeP( (Vec_Vec_t **)&p->vCuts );

    if ( p->pMatrix )
        Llb_MtrFree( p->pMatrix );
    Vec_PtrForEachEntry( Llb_Grp_t *, p->vGroups, pGrp, i )
        Llb_ManGroupStop( pGrp );
    if ( p->dd )
    {
//        printf( "Manager dd\n" );
        Extra_StopManager( p->dd );
    }
    if ( p->ddG )
    {
//        printf( "Manager ddG\n" );
        if ( p->ddG->bFunc )
            Cudd_RecursiveDeref( p->ddG, p->ddG->bFunc ); 
        Extra_StopManager( p->ddG );
    }
    if ( p->ddR )
    {
//        printf( "Manager ddR\n" );
        if ( p->ddR->bFunc )
            Cudd_RecursiveDeref( p->ddR, p->ddR->bFunc ); 
        Vec_PtrForEachEntry( DdNode *, p->vRings, bTemp, i )
            Cudd_RecursiveDeref( p->ddR, bTemp );
        Extra_StopManager( p->ddR );
    }
    Aig_ManStop( p->pAig );
    Vec_PtrFreeP( &p->vGroups );
    Vec_IntFreeP( &p->vVar2Obj );
    Vec_IntFreeP( &p->vObj2Var );
    Vec_IntFreeP( &p->vVarBegs );
    Vec_IntFreeP( &p->vVarEnds );
    Vec_PtrFreeP( &p->vRings  );
    Vec_IntFreeP( &p->vNs2Glo );
    Vec_IntFreeP( &p->vCs2Glo );
    Vec_IntFreeP( &p->vGlo2Cs );
    Vec_IntFreeP( &p->vGlo2Ns );
//    Vec_IntFreeP( &p->vHints );
    ABC_FREE( p );
}